

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O3

void __thiscall HTTPResponse::parse(HTTPResponse *this)

{
  string *this_00;
  pointer pcVar1;
  _List_node_base *p_Var2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  HTTPResponse *local_38;
  
  local_98[0] = local_88;
  pcVar1 = (this->version)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar1,pcVar1 + (this->version)._M_string_length);
  std::__cxx11::string::append((char *)local_98);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_98,(ulong)(this->status)._M_dataplus._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar5;
    local_78 = (long *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_48 = *plVar5;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar5;
    local_58 = (long *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = &this->raw;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_38 = this;
  for (p_Var2 = (this->header).
                super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->header; p_Var2 = p_Var2->_M_next) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,p_Var2[3]._M_next,
               (long)&(p_Var2[3]._M_prev)->_M_next + (long)p_Var2[3]._M_next);
    std::__cxx11::string::append((char *)local_98);
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)local_98,(ulong)p_Var2[1]._M_next);
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = puVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*puVar4;
    }
    local_70 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar4[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar4;
    }
    local_50 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
  }
  std::__cxx11::string::append((char *)this_00);
  std::__cxx11::string::_M_append((char *)this_00,(ulong)(local_38->data)._M_dataplus._M_p);
  return;
}

Assistant:

void HTTPResponse::parse() {
    this->raw = this->version + " " + this->status + "\r\n";
    for (auto && item : this->header) {
        this->raw += std::get<0>(item) + ": " + std::get<1>(item) + "\r\n";
    }
    this->raw += "\r\n";
    this->raw += this->data;
}